

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall xray_re::cse_alife_car::state_read(cse_alife_car *this)

{
  uint16_t in_DX;
  xr_packet *in_RSI;
  
  state_read((cse_alife_car *)
             &this[-1].super_cse_alife_dynamic_object_visual.super_cse_alife_dynamic_object.
              super_cse_alife_object.super_cse_abstract.m_id_parent,in_RSI,in_DX);
  return;
}

Assistant:

void cse_alife_car::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_dynamic_object_visual::state_read(packet, size);
	if (m_version > CSE_VERSION_0x41)
		cse_ph_skeleton::state_read(packet, size);
	if (m_version > CSE_VERSION_0x34 && m_version < CSE_VERSION_0x37)
		packet.r_float();
	if (m_version > CSE_VERSION_0x5c)
		packet.r_float(m_health);
	if (m_health > 1.f)
		m_health *= 0.01f;
}